

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::unpack_expression_type
          (CompilerMSL *this,string *expr_str,SPIRType *type,uint32_t physical_type_id,bool packed,
          bool row_major)

{
  char *pcVar1;
  bool bVar2;
  undefined4 in_register_0000000c;
  undefined7 in_register_00000081;
  byte in_stack_00000008;
  uint local_1bc;
  byte local_182;
  bool local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150 [32];
  spirv_cross local_130 [32];
  spirv_cross local_110 [36];
  uint local_ec;
  char *pcStack_e8;
  uint32_t i;
  char *data_swiz;
  char *load_swiz;
  char *local_d0;
  char *base_type;
  uint local_c0;
  uint32_t physical_vecsize;
  uint32_t columns;
  uint32_t vecsize;
  undefined1 local_98 [56];
  string local_60 [39];
  bool local_39;
  SPIRType *pSStack_38;
  bool uses_std140_wrapper;
  SPIRType *physical_type;
  bool row_major_local;
  bool packed_local;
  SPIRType *pSStack_28;
  uint32_t physical_type_id_local;
  SPIRType *type_local;
  string *expr_str_local;
  CompilerMSL *this_local;
  string *unpack_expr;
  
  pSStack_28 = (SPIRType *)CONCAT44(in_register_0000000c,physical_type_id);
  physical_type._4_4_ = (uint32_t)CONCAT71(in_register_00000081,packed);
  physical_type._2_1_ = in_stack_00000008 & 1;
  physical_type._3_1_ = row_major;
  type_local = type;
  expr_str_local = expr_str;
  this_local = this;
  if ((physical_type._4_4_ != 0) || (row_major)) {
    pSStack_38 = (SPIRType *)0x0;
    if (physical_type._4_4_ != 0) {
      pSStack_38 = Compiler::get<spirv_cross::SPIRType>((Compiler *)expr_str,physical_type._4_4_);
    }
    local_181 = false;
    if (pSStack_38 != (SPIRType *)0x0) {
      local_181 = 4 < pSStack_38->vecsize;
    }
    local_39 = local_181;
    local_98[0x36] = 0;
    local_98[0x23] = 0;
    local_182 = 0;
    if (pSStack_38 != (SPIRType *)0x0) {
      bVar2 = Compiler::is_vector((Compiler *)expr_str,pSStack_38);
      local_182 = 0;
      if (bVar2) {
        bVar2 = Compiler::is_array((Compiler *)expr_str,pSStack_38);
        local_182 = 0;
        if (((bVar2) && (local_182 = 0, (local_39 & 1U) == 0)) &&
           (local_182 = 0, pSStack_28->vecsize < pSStack_38->vecsize)) {
          pcVar1 = unpack_expression_type::swizzle_lut[pSStack_28->vecsize - 1];
          ::std::allocator<char>::allocator();
          local_98[0x36] = 1;
          ::std::__cxx11::string::string(local_60,pcVar1,(allocator *)(local_98 + 0x37));
          local_98[0x23] = 1;
          bVar2 = expression_ends_with((string *)type,(string *)local_60);
          local_182 = bVar2 ^ 0xff;
        }
      }
    }
    if ((local_98[0x23] & 1) != 0) {
      ::std::__cxx11::string::~string(local_60);
    }
    if ((local_98[0x36] & 1) != 0) {
      ::std::allocator<char>::~allocator((allocator<char> *)(local_98 + 0x37));
    }
    if ((local_182 & 1) == 0) {
      if (((pSStack_38 == (SPIRType *)0x0) ||
          (bVar2 = Compiler::is_matrix((Compiler *)expr_str,pSStack_38), !bVar2)) ||
         ((bVar2 = Compiler::is_vector((Compiler *)expr_str,pSStack_28), !bVar2 ||
          (((local_39 & 1U) != 0 || (pSStack_38->vecsize <= pSStack_28->vecsize)))))) {
        bVar2 = Compiler::is_matrix((Compiler *)expr_str,pSStack_28);
        if (bVar2) {
          if (pSStack_38 == (SPIRType *)0x0) {
            pSStack_38 = pSStack_28;
          }
          physical_vecsize = pSStack_28->vecsize;
          local_c0 = pSStack_28->columns;
          if ((physical_type._2_1_ & 1) != 0) {
            ::std::swap<unsigned_int>(&physical_vecsize,&local_c0);
          }
          if ((physical_type._2_1_ & 1) == 0) {
            local_1bc = pSStack_38->vecsize;
          }
          else {
            local_1bc = pSStack_38->columns;
          }
          base_type._4_4_ = local_1bc;
          local_d0 = "float";
          if (pSStack_28->width == 0x10) {
            local_d0 = "half";
          }
          load_swiz._7_1_ = 0;
          join<char_const*&,unsigned_int&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                    ((spirv_cross *)this,&local_d0,&local_c0,(char (*) [2])0x41f771,
                     &physical_vecsize,(char (*) [2])0x422b6e);
          data_swiz = "";
          pcStack_e8 = "";
          if (4 < base_type._4_4_) {
            pcStack_e8 = ".data";
          }
          if (base_type._4_4_ != physical_vecsize) {
            data_swiz = unpack_expression_type::swizzle_lut[physical_vecsize - 1];
          }
          for (local_ec = 0; local_ec < local_c0; local_ec = local_ec + 1) {
            if (local_ec != 0) {
              ::std::__cxx11::string::operator+=((string *)this,", ");
            }
            if ((physical_type._3_1_ & 1) == 0) {
              join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const*&,char_const*&>
                        (local_130,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type,
                         (char (*) [2])0x40f992,&local_ec,(char (*) [2])0x40f897,
                         &stack0xffffffffffffff18,&data_swiz);
              ::std::__cxx11::string::operator+=((string *)this,(string *)local_130);
              ::std::__cxx11::string::~string((string *)local_130);
            }
            else {
              join<char_const*&,unsigned_int&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[2],char_const*&>
                        (local_110,&local_d0,(uint *)((long)&base_type + 4),(char (*) [2])0x422b6e,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type,
                         (char (*) [2])0x40f992,&local_ec,(char (*) [2])0x40f897,
                         (char (*) [2])0x40bd22,&data_swiz);
              ::std::__cxx11::string::operator+=((string *)this,(string *)local_110);
              ::std::__cxx11::string::~string((string *)local_110);
            }
          }
          ::std::__cxx11::string::operator+=((string *)this,")");
        }
        else {
          (**(code **)(*(long *)expr_str + 0x98))(local_150,expr_str,pSStack_28,0);
          join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                    ((spirv_cross *)this,local_150,(char (*) [2])0x422b6e,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type,
                     (char (*) [2])0x40bd22);
          ::std::__cxx11::string::~string((string *)local_150);
        }
      }
      else {
        bVar2 = false;
        if (pSStack_28->vecsize != 0) {
          bVar2 = pSStack_28->vecsize < 5;
        }
        if (!bVar2) {
          __assert_fail("type.vecsize >= 1 && type.vecsize <= 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x15d6,
                        "virtual string spirv_cross::CompilerMSL::unpack_expression_type(string, const SPIRType &, uint32_t, bool, bool)"
                       );
        }
        CompilerGLSL::enclose_expression((CompilerGLSL *)&columns,expr_str);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         (char *)&columns);
        ::std::__cxx11::string::~string((string *)&columns);
      }
    }
    else {
      bVar2 = false;
      if (pSStack_28->vecsize != 0) {
        bVar2 = pSStack_28->vecsize < 4;
      }
      if (!bVar2) {
        __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x15ce,
                      "virtual string spirv_cross::CompilerMSL::unpack_expression_type(string, const SPIRType &, uint32_t, bool, bool)"
                     );
      }
      CompilerGLSL::enclose_expression((CompilerGLSL *)local_98,expr_str);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)local_98);
      ::std::__cxx11::string::~string((string *)local_98);
    }
  }
  else {
    ::std::__cxx11::string::string((string *)this,(string *)type);
  }
  return this;
}

Assistant:

string CompilerMSL::unpack_expression_type(string expr_str, const SPIRType &type, uint32_t physical_type_id,
                                           bool packed, bool row_major)
{
	// Trivial case, nothing to do.
	if (physical_type_id == 0 && !packed)
		return expr_str;

	const SPIRType *physical_type = nullptr;
	if (physical_type_id)
		physical_type = &get<SPIRType>(physical_type_id);

	static const char *swizzle_lut[] = {
		".x",
		".xy",
		".xyz",
		"",
	};

	// TODO: Move everything to the template wrapper?
	bool uses_std140_wrapper = physical_type && physical_type->vecsize > 4;

	if (physical_type && is_vector(*physical_type) && is_array(*physical_type) &&
	    !uses_std140_wrapper &&
	    physical_type->vecsize > type.vecsize && !expression_ends_with(expr_str, swizzle_lut[type.vecsize - 1]))
	{
		// std140 array cases for vectors.
		assert(type.vecsize >= 1 && type.vecsize <= 3);
		return enclose_expression(expr_str) + swizzle_lut[type.vecsize - 1];
	}
	else if (physical_type && is_matrix(*physical_type) && is_vector(type) &&
	         !uses_std140_wrapper &&
	         physical_type->vecsize > type.vecsize)
	{
		// Extract column from padded matrix.
		assert(type.vecsize >= 1 && type.vecsize <= 4);
		return enclose_expression(expr_str) + swizzle_lut[type.vecsize - 1];
	}
	else if (is_matrix(type))
	{
		// Packed matrices are stored as arrays of packed vectors. Unfortunately,
		// we can't just pass the array straight to the matrix constructor. We have to
		// pass each vector individually, so that they can be unpacked to normal vectors.
		if (!physical_type)
			physical_type = &type;

		uint32_t vecsize = type.vecsize;
		uint32_t columns = type.columns;
		if (row_major)
			swap(vecsize, columns);

		uint32_t physical_vecsize = row_major ? physical_type->columns : physical_type->vecsize;

		const char *base_type = type.width == 16 ? "half" : "float";
		string unpack_expr = join(base_type, columns, "x", vecsize, "(");

		const char *load_swiz = "";
		const char *data_swiz = physical_vecsize > 4 ? ".data" : "";

		if (physical_vecsize != vecsize)
			load_swiz = swizzle_lut[vecsize - 1];

		for (uint32_t i = 0; i < columns; i++)
		{
			if (i > 0)
				unpack_expr += ", ";

			if (packed)
				unpack_expr += join(base_type, physical_vecsize, "(", expr_str, "[", i, "]", ")", load_swiz);
			else
				unpack_expr += join(expr_str, "[", i, "]", data_swiz, load_swiz);
		}

		unpack_expr += ")";
		return unpack_expr;
	}
	else
	{
		return join(type_to_glsl(type), "(", expr_str, ")");
	}
}